

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreTexture.h
# Opt level: O2

void __thiscall
irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>::unlock
          (COpenGLCoreTexture<irr::video::COpenGLDriver> *this)

{
  byte bVar1;
  u32 layer;
  long lVar2;
  ITexture *texture;
  void *data;
  IImage *pIVar3;
  
  pIVar3 = this->LockImage;
  if (pIVar3 != (IImage *)0x0) {
    if (this->LockReadOnly == false) {
      lVar2 = *(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8);
      texture = *(ITexture **)(lVar2 + 0x20);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)(lVar2 + 0x10),0,&this->super_ITexture,EST_ACTIVE_ALWAYS);
      layer = this->LockLayer;
      bVar1 = this->MipLevelStored;
      data = getLockImageData(this,(uint)bVar1);
      uploadTexture(this,false,layer,(uint)bVar1,data);
      COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
      ::STextureCache::set
                ((STextureCache *)
                 (*(long *)(*(long *)&(this->super_ITexture).field_0x78 + 0xbe8) + 0x10),0,texture,
                 EST_ACTIVE_ALWAYS);
      pIVar3 = this->LockImage;
    }
    IReferenceCounted::drop
              ((IReferenceCounted *)((long)&pIVar3->_vptr_IImage + (long)pIVar3->_vptr_IImage[-3]));
    this->LockReadOnly = false;
    this->LockImage = (IImage *)0x0;
    this->LockLayer = 0;
  }
  return;
}

Assistant:

void unlock() override
	{
		if (!LockImage)
			return;

		if (!LockReadOnly) {
			const COpenGLCoreTexture *prevTexture = Driver->getCacheHandler()->getTextureCache().get(0);
			Driver->getCacheHandler()->getTextureCache().set(0, this);

			uploadTexture(false, LockLayer, MipLevelStored, getLockImageData(MipLevelStored));

			Driver->getCacheHandler()->getTextureCache().set(0, prevTexture);
		}

		LockImage->drop();

		LockReadOnly = false;
		LockImage = 0;
		LockLayer = 0;
	}